

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.cpp
# Opt level: O2

void glu::parseTypePath(char *nameWithPath,VarType *type,TypeComponentVector *path)

{
  pointer pVVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  TestError *pTVar6;
  long lVar7;
  long lVar8;
  VarTypeComponent local_90;
  VarType curType;
  VarTokenizer tokenizer;
  string memberName;
  
  VarTokenizer::VarTokenizer(&tokenizer,nameWithPath);
  if (tokenizer.m_token == TOKEN_IDENTIFIER) {
    VarTokenizer::advance(&tokenizer);
  }
  pVVar1 = (path->super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if ((path->super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (path->super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>).
    _M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  do {
    if (tokenizer.m_token == TOKEN_END) {
      return;
    }
    getVarType(&curType,type,path);
    if (tokenizer.m_token == TOKEN_LEFT_BRACKET) {
      VarTokenizer::advance(&tokenizer);
      if (tokenizer.m_token != TOKEN_NUMBER) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_NUMBER",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                   ,0x83);
        goto LAB_008dd176;
      }
      iVar4 = VarTokenizer::getNumber(&tokenizer);
      if (curType.m_type == TYPE_BASIC) {
        if (curType.m_data.basic.type - TYPE_FLOAT_MAT2 < 9 ||
            curType.m_data.basic.type - TYPE_DOUBLE_MAT2 < 9) {
          iVar5 = getDataTypeMatrixNumColumns(curType.m_data.basic.type);
          if ((iVar4 < 0) || (iVar5 <= iVar4)) {
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,(char *)0x0,
                       "de::inBounds(ndx, 0, getDataTypeMatrixNumColumns(curType.getBasicType()))",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                       ,0x8e);
            goto LAB_008dd20b;
          }
          memberName._M_dataplus._M_p._0_4_ = 2;
          memberName._M_dataplus._M_p._4_4_ = iVar4;
          std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
          emplace_back<glu::VarTypeComponent>(path,(VarTypeComponent *)&memberName);
        }
        else {
          if (((TYPE_UINT_VEC4 < curType.m_data.basic.type) ||
              ((0x77003801cU >> ((ulong)curType.m_data.basic.type & 0x3f) & 1) == 0)) &&
             (2 < curType.m_data.basic.type - TYPE_BOOL_VEC2)) goto LAB_008dd01e;
          iVar5 = getDataTypeScalarSize(curType.m_data.basic.type);
          if ((iVar4 < 0) || (iVar5 <= iVar4)) {
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,(char *)0x0,
                       "de::inBounds(ndx, 0, getDataTypeScalarSize(curType.getBasicType()))",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                       ,0x93);
            goto LAB_008dd20b;
          }
          memberName._M_dataplus._M_p._0_4_ = 3;
          memberName._M_dataplus._M_p._4_4_ = iVar4;
          std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
          emplace_back<glu::VarTypeComponent>(path,(VarTypeComponent *)&memberName);
        }
      }
      else {
        if (curType.m_type != TYPE_ARRAY) {
LAB_008dd01e:
          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar6,"Invalid subscript",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x97);
          goto LAB_008dd20b;
        }
        if ((iVar4 < 0) || (curType.m_data.array.size <= iVar4)) {
          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar6,(char *)0x0,"de::inBounds(ndx, 0, curType.getArraySize())",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x89);
          goto LAB_008dd20b;
        }
        memberName._M_dataplus._M_p._0_4_ = 1;
        memberName._M_dataplus._M_p._4_4_ = iVar4;
        std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        emplace_back<glu::VarTypeComponent>(path,(VarTypeComponent *)&memberName);
      }
      VarTokenizer::advance(&tokenizer);
      if (tokenizer.m_token != TOKEN_RIGHT_BRACKET) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_RIGHT_BRACKET",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                   ,0x9a);
LAB_008dd20b:
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      VarTokenizer::advance(&tokenizer);
    }
    else {
      if (tokenizer.m_token != TOKEN_PERIOD) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"Unexpected token",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                   ,0x9e);
LAB_008dd176:
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      VarTokenizer::advance(&tokenizer);
      if (tokenizer.m_token != TOKEN_IDENTIFIER) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                   ,0x70);
        goto LAB_008dd176;
      }
      if (curType.m_type != TYPE_STRUCT) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"Invalid field selector","curType.isStructType()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                   ,0x71);
        goto LAB_008dd176;
      }
      VarTokenizer::getIdentifier_abi_cxx11_(&memberName,&tokenizer);
      lVar8 = 0;
      lVar7 = 0;
      while( true ) {
        lVar2 = *(long *)(CONCAT44(curType.m_data.basic.precision,curType.m_data.basic.type) + 0x20)
        ;
        iVar4 = (int)((*(long *)(CONCAT44(curType.m_data.basic.precision,curType.m_data.basic.type)
                                + 0x28) - lVar2) / 0x38);
        if (iVar4 <= lVar7) break;
        bVar3 = std::operator==(&memberName,*(char **)(lVar2 + lVar8));
        if (bVar3) {
          iVar4 = (int)((*(long *)(CONCAT44(curType.m_data.basic.precision,curType.m_data.basic.type
                                           ) + 0x28) -
                        *(long *)(CONCAT44(curType.m_data.basic.precision,curType.m_data.basic.type)
                                 + 0x20)) / 0x38);
          break;
        }
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x38;
      }
      if (iVar4 <= (int)lVar7) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,"Member not found in type","ndx < curType.getStructPtr()->getNumMembers()"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                   ,0x7b);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      local_90.type = STRUCT_MEMBER;
      local_90.index = (int)lVar7;
      std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
      emplace_back<glu::VarTypeComponent>(path,&local_90);
      VarTokenizer::advance(&tokenizer);
      std::__cxx11::string::~string((string *)&memberName);
    }
    VarType::~VarType(&curType);
  } while( true );
}

Assistant:

void parseTypePath (const char* nameWithPath, const VarType& type, TypeComponentVector& path)
{
	VarTokenizer tokenizer(nameWithPath);

	if (tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER)
		tokenizer.advance();

	path.clear();
	while (tokenizer.getToken() != VarTokenizer::TOKEN_END)
	{
		VarType curType = getVarType(type, path);

		if (tokenizer.getToken() == VarTokenizer::TOKEN_PERIOD)
		{
			tokenizer.advance();
			TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER);
			TCU_CHECK_MSG(curType.isStructType(), "Invalid field selector");

			// Find member.
			std::string		memberName	= tokenizer.getIdentifier();
			int				ndx			= 0;
			for (; ndx < curType.getStructPtr()->getNumMembers(); ndx++)
			{
				if (memberName == curType.getStructPtr()->getMember(ndx).getName())
					break;
			}
			TCU_CHECK_MSG(ndx < curType.getStructPtr()->getNumMembers(), "Member not found in type");

			path.push_back(VarTypeComponent(VarTypeComponent::STRUCT_MEMBER, ndx));
			tokenizer.advance();
		}
		else if (tokenizer.getToken() == VarTokenizer::TOKEN_LEFT_BRACKET)
		{
			tokenizer.advance();
			TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_NUMBER);

			int ndx = tokenizer.getNumber();

			if (curType.isArrayType())
			{
				TCU_CHECK(de::inBounds(ndx, 0, curType.getArraySize()));
				path.push_back(VarTypeComponent(VarTypeComponent::ARRAY_ELEMENT, ndx));
			}
			else if (curType.isBasicType() && isDataTypeMatrix(curType.getBasicType()))
			{
				TCU_CHECK(de::inBounds(ndx, 0, getDataTypeMatrixNumColumns(curType.getBasicType())));
				path.push_back(VarTypeComponent(VarTypeComponent::MATRIX_COLUMN, ndx));
			}
			else if (curType.isBasicType() && isDataTypeVector(curType.getBasicType()))
			{
				TCU_CHECK(de::inBounds(ndx, 0, getDataTypeScalarSize(curType.getBasicType())));
				path.push_back(VarTypeComponent(VarTypeComponent::VECTOR_COMPONENT, ndx));
			}
			else
				TCU_FAIL("Invalid subscript");

			tokenizer.advance();
			TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_RIGHT_BRACKET);
			tokenizer.advance();
		}
		else
			TCU_FAIL("Unexpected token");
	}
}